

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbm.cc
# Opt level: O0

void tchecker::dbm::zero(db_t *dbm,clock_id_t dim)

{
  bool bVar1;
  uint local_1c;
  uint local_18;
  clock_id_t j;
  clock_id_t i;
  clock_id_t dim_local;
  db_t *dbm_local;
  
  if (dbm == (db_t *)0x0) {
    __assert_fail("dbm != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/dbm.cc"
                  ,0x48,"void tchecker::dbm::zero(tchecker::dbm::db_t *, tchecker::clock_id_t)");
  }
  if (dim != 0) {
    for (local_18 = 0; local_18 < dim; local_18 = local_18 + 1) {
      for (local_1c = 0; local_1c < dim; local_1c = local_1c + 1) {
        dbm[local_18 * dim + local_1c] = (db_t)0x1;
      }
    }
    bVar1 = is_consistent(dbm,dim);
    if (!bVar1) {
      __assert_fail("tchecker::dbm::is_consistent(dbm, dim)",
                    "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/dbm.cc"
                    ,0x4d,"void tchecker::dbm::zero(tchecker::dbm::db_t *, tchecker::clock_id_t)");
    }
    bVar1 = is_tight(dbm,dim);
    if (!bVar1) {
      __assert_fail("tchecker::dbm::is_tight(dbm, dim)",
                    "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/dbm.cc"
                    ,0x4e,"void tchecker::dbm::zero(tchecker::dbm::db_t *, tchecker::clock_id_t)");
    }
    return;
  }
  __assert_fail("dim >= 1",
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/dbm/dbm.cc"
                ,0x49,"void tchecker::dbm::zero(tchecker::dbm::db_t *, tchecker::clock_id_t)");
}

Assistant:

void zero(tchecker::dbm::db_t * dbm, tchecker::clock_id_t dim)
{
  assert(dbm != nullptr);
  assert(dim >= 1);
  for (tchecker::clock_id_t i = 0; i < dim; ++i)
    for (tchecker::clock_id_t j = 0; j < dim; ++j)
      DBM(i, j) = tchecker::dbm::LE_ZERO;
  assert(tchecker::dbm::is_consistent(dbm, dim));
  assert(tchecker::dbm::is_tight(dbm, dim));
}